

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAmbientLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  undefined8 *in_RDX;
  string *childID;
  Vec3fa VVar1;
  Vec3fa L;
  allocator local_51;
  undefined1 local_50 [8];
  AmbientLight local_48;
  _Alloc_hider local_28;
  _Alloc_hider _Stack_20;
  
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_48,"L",&local_51);
  XML::child((XML *)local_50,childID);
  VVar1 = load<embree::Vec3fa>((XMLLoader *)&stack0xffffffffffffffd8,(Ref<embree::XML> *)childID);
  if (local_50 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_50 + 0x18))(VVar1.field_0._0_4_,VVar1.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (LightNodeImpl<embree::SceneGraph::AmbientLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::operator_new(0x90);
  local_48.super_Light.type = LIGHT_AMBIENT;
  local_48.L.field_0._0_8_ = local_28._M_p;
  local_48.L.field_0._8_8_ = _Stack_20._M_p;
  SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::LightNodeImpl(this_00,&local_48);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAmbientLight(const Ref<XML>& xml) 
  {
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    return new SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>(SceneGraph::AmbientLight(L));
  }